

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::PoolingLayerParams::SharedCtor(PoolingLayerParams *this)

{
  PoolingLayerParams *this_local;
  
  memset(&this->type_,0,6);
  clear_has_PoolingPaddingType(this);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void PoolingLayerParams::SharedCtor() {
  ::memset(&type_, 0, reinterpret_cast<char*>(&globalpooling_) -
    reinterpret_cast<char*>(&type_) + sizeof(globalpooling_));
  clear_has_PoolingPaddingType();
  _cached_size_ = 0;
}